

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O2

int floatx80_unordered_quiet_aarch64(floatx80 a,floatx80 b,float_status *status)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar2 = a.high & 0x7fff;
  if (((long)a.low < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
     && (uVar1 = b.high & 0x7fff,
        (long)b.low < 0 || ((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0
        )) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
         uVar2 != 0x7fff) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        uVar1 != 0x7fff)) {
      return 0;
    }
    if (((uVar2 != 0x7fff) ||
        (((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0)) ||
       (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0)) {
      if (uVar1 != 0x7fff) {
        return 1;
      }
      if (((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
        return 1;
      }
      if (((undefined1  [16])b & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0) {
        return 1;
      }
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return 1;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}